

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

bool duckdb::UncompressedStringStorage::StringAnalyze
               (AnalyzeState *state_p,Vector *input,idx_t count)

{
  uint uVar1;
  idx_t iVar2;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  state_p[1]._vptr_AnalyzeState = (_func_int **)((long)state_p[1]._vptr_AnalyzeState + count);
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = uVar4;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)(local_78.sel)->sel_vector[uVar4];
    }
    if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
         (uVar3 & 0x3f) & 1) != 0)) {
      uVar1 = *(uint *)(local_78.data + uVar3 * 0x10);
      state_p[1].info.block_manager =
           (BlockManager *)
           ((long)&(state_p[1].info.block_manager)->_vptr_BlockManager + (ulong)uVar1);
      iVar2 = CompressionInfo::GetBlockSize(&state_p->info);
      uVar3 = iVar2 >> 2 & 0xfffffffffffffff8;
      if (0xfff < uVar3) {
        uVar3 = 0x1000;
      }
      if ((uint)uVar3 <= uVar1) {
        state_p[2]._vptr_AnalyzeState = (_func_int **)((long)state_p[2]._vptr_AnalyzeState + 1);
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return true;
}

Assistant:

bool UncompressedStringStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<StringAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	state.count += count;
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (vdata.validity.RowIsValid(idx)) {
			auto string_size = data[idx].GetSize();
			state.total_string_size += string_size;
			if (string_size >= StringUncompressed::GetStringBlockLimit(state.info.GetBlockSize())) {
				state.overflow_strings++;
			}
		}
	}
	return true;
}